

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::add_value(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *this,value_type *v)

{
  double dVar1;
  reference puVar2;
  reference ppVar3;
  size_type n;
  
  if ((this->overwritable_values_).
      super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.
      m_holder.m_size == 0) {
    n = (this->container_).m_holder.m_size;
    boost::container::
    vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,void>
    ::priv_push_back<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>const&>
              ((vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,void>
                *)&this->container_,v);
  }
  else {
    puVar2 = boost::container::
             vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
             ::back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                     *)&this->overwritable_values_);
    n = *puVar2;
    boost::container::
    vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
    ::pop_back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                *)&this->overwritable_values_);
    ppVar3 = boost::container::
             vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
             ::at(&this->container_,n);
    dVar1 = (v->first).center.values_.elems[1];
    (ppVar3->first).center.values_.elems[0] = (v->first).center.values_.elems[0];
    (ppVar3->first).center.values_.elems[1] = dVar1;
    dVar1 = (v->first).radius.values_.elems[1];
    (ppVar3->first).radius.values_.elems[0] = (v->first).radius.values_.elems[0];
    (ppVar3->first).radius.values_.elems[1] = dVar1;
    ppVar3->second = v->second;
  }
  return n;
}

Assistant:

std::size_t add_value(const value_type& v)
    {
        if(overwritable_values_.empty())
        {
            const std::size_t idx = container_.size();
            container_.push_back(v);
            return idx;
        }
        else
        {
            const std::size_t idx = overwritable_values_.back();
            overwritable_values_.pop_back();
            container_.at(idx) = v;
            return idx;
        }
    }